

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O1

StringTree * capnp::prettyPrint(Builder value)

{
  Reader value_00;
  undefined8 unaff_RBX;
  StringTree *in_RDI;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  undefined8 unaff_retaddr;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  _::StructBuilder::asReader((StructBuilder *)&stack0x00000010);
  value_00.reader.segment = (SegmentReader *)in_stack_ffffffffffffffd8;
  value_00.schema.super_Schema.raw = (Schema)(Schema)in_stack_ffffffffffffffd0;
  value_00.reader.capTable = (CapTableReader *)in_stack_ffffffffffffffe0;
  value_00.reader.data = (void *)unaff_RBX;
  value_00.reader.pointers = (WirePointer *)unaff_R14;
  value_00.reader.dataSize = (int)unaff_R15;
  value_00.reader.pointerCount = (short)((ulong)unaff_R15 >> 0x20);
  value_00.reader._38_2_ = (short)((ulong)unaff_R15 >> 0x30);
  value_00.reader._40_8_ = unaff_retaddr;
  prettyPrint(value_00);
  return in_RDI;
}

Assistant:

kj::StringTree prettyPrint(DynamicStruct::Builder value) { return prettyPrint(value.asReader()); }